

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O2

void Maj_ManFree(Maj_Man_t *p)

{
  bmcg_sat_solver_stop(p->pSat);
  Vec_WrdFree(p->vInfo);
  Vec_WecFree(p->vOutLits);
  free(p);
  return;
}

Assistant:

void Maj_ManFree( Maj_Man_t * p )
{
    bmcg_sat_solver_stop( p->pSat );
    Vec_WrdFree( p->vInfo );
    Vec_WecFree( p->vOutLits );
    ABC_FREE( p );
}